

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void init_sprite(Sprite *spr,int image,float x,float y,float scale,float opacity)

{
  int i;
  float opacity_local;
  float scale_local;
  float y_local;
  float x_local;
  int image_local;
  Sprite *spr_local;
  
  spr->image = image;
  spr->x = x;
  spr->y = y;
  spr->scale_y = scale;
  spr->scale_x = scale;
  spr->align_y = 0.5;
  spr->align_x = 0.5;
  spr->angle = 0.0;
  spr->b = 1.0;
  spr->g = 1.0;
  spr->r = 1.0;
  spr->opacity = opacity;
  for (i = 0; i < 10; i = i + 1) {
    spr->anims[i].lval = (float *)0x0;
  }
  return;
}

Assistant:

static void init_sprite(Sprite *spr, int image, float x, float y, float scale,
   float opacity)
{
   int i;

   spr->image = image;
   spr->x = x;
   spr->y = y;
   spr->scale_x = spr->scale_y = scale;
   spr->align_x = spr->align_y = 0.5;
   spr->angle = 0.0;
   spr->r = spr->g = spr->b = 1.0;
   spr->opacity = opacity;
   for (i = 0; i < MAX_ANIMS; i++)
      spr->anims[i].lval = NULL;
}